

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

U8 * GetUnit_abi_cxx11_(U8 *pItem)

{
  long in_RSI;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [15];
  allocator local_1e;
  byte local_1d;
  uint local_1c;
  U8 firstNibble;
  U32 val;
  U8 *pItem_local;
  
  local_1c = *(uint *)(in_RSI + 1);
  local_1d = (byte)local_1c & 0xf;
  pItem_local = pItem;
  if ((local_1c & 0xf0) == 0) {
    if ((local_1c & 0xf00) == 0) {
      if ((local_1c & 0xf000) == 0) {
        if ((local_1c & 0xf0000) == 0) {
          if ((local_1c & 0xf00000) == 0) {
            if (((local_1c & 0xf000000) != 0) && (((local_1c & 0xf) != 0 || (local_1d < 5)))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)pItem,"Candela",&local_36);
              std::allocator<char>::~allocator((allocator<char> *)&local_36);
              return pItem;
            }
          }
          else if (((local_1c & 0xf) != 0) || (local_1d < 5)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)pItem,"Ampere",&local_35);
            std::allocator<char>::~allocator((allocator<char> *)&local_35);
            return pItem;
          }
        }
        else {
          if ((local_1d == 1) || (local_1d == 2)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)pItem,"Kelvin",&local_33);
            std::allocator<char>::~allocator((allocator<char> *)&local_33);
            return pItem;
          }
          if ((local_1d == 3) || (local_1d == 4)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)pItem,"Fahrenheit",&local_34);
            std::allocator<char>::~allocator((allocator<char> *)&local_34);
            return pItem;
          }
        }
      }
      else if (((local_1c & 0xf) != 0) || (local_1d < 5)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)pItem,"Second",&local_32);
        std::allocator<char>::~allocator((allocator<char> *)&local_32);
        return pItem;
      }
    }
    else {
      if ((local_1d == 1) || (local_1d == 2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)pItem,"Gram",&local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_30);
        return pItem;
      }
      if ((local_1d == 3) || (local_1d == 4)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)pItem,"Slug",&local_31);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
        return pItem;
      }
    }
switchD_001484d9_default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)pItem,"Undefined Unit",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else {
    switch(local_1d) {
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)pItem,"Centimeter",&local_1e);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)pItem,"Radian",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)pItem,"Inch",&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)pItem,"Degree",&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      break;
    default:
      goto switchD_001484d9_default;
    }
  }
  return pItem;
}

Assistant:

std::string GetUnit( const U8* pItem )
{
    U32 val = *( U32* )( pItem + 1 );

    U8 firstNibble = val & 0x0f;

    // branch by quality measures
    if( val & 0x000000f0 ) // Length
    {
        switch( firstNibble )
        {
        case 1:
            return "Centimeter";
        case 2:
            return "Radian";
        case 3:
            return "Inch";
        case 4:
            return "Degree";
        }
    }
    else if( val & 0x00000f00 )
    { // Mass

        if( firstNibble == 1 || firstNibble == 2 )
            return "Gram";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Slug";
    }
    else if( val & 0x0000f000 )
    { // Time

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Second";
    }
    else if( val & 0x000f0000 )
    { // Temperature

        if( firstNibble == 1 || firstNibble == 2 )
            return "Kelvin";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Fahrenheit";
    }
    else if( val & 0x00f00000 )
    { // Current

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Ampere";
    }
    else if( val & 0x0f000000 )
    { // Luminosity

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Candela";
    }

    return "Undefined Unit";
}